

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

void printexpr(FILE *out,expr *expr,int lvl)

{
  int iVar1;
  uint uVar2;
  char **ppcVar3;
  char *pcVar4;
  expr *expr_00;
  char *pcVar5;
  char *__format;
  long lVar6;
  
LAB_0016bba4:
  pcVar4 = "%s~";
  lVar6 = 0x20;
  iVar1 = 7;
  switch(expr->type) {
  case EXPR_NUM:
    goto switchD_0016bbc5_caseD_0;
  case EXPR_ID:
    pcVar4 = expr->str;
    if (expr->special == 2) {
      ppcVar3 = &cunk;
    }
    else if (expr->special == 1) {
      ppcVar3 = &cnum;
    }
    else {
      ppcVar3 = &cname;
    }
    pcVar5 = *ppcVar3;
    __format = "%s%s";
    goto LAB_0016c2aa;
  case EXPR_LABEL:
    pcVar4 = expr->str;
    if (expr->special == 2) {
      ppcVar3 = &cunk;
    }
    else {
      ppcVar3 = &cnum;
    }
    pcVar5 = *ppcVar3;
    __format = "%s#%s";
    goto LAB_0016c2aa;
  case EXPR_REG:
    pcVar4 = expr->str;
    if (expr->special == 2) {
      ppcVar3 = &cunk;
    }
    else if (expr->special == 1) {
      ppcVar3 = &creg1;
    }
    else {
      ppcVar3 = &creg0;
    }
    pcVar5 = *ppcVar3;
    __format = "%s$%s";
LAB_0016c2aa:
    fprintf((FILE *)out,__format,pcVar5,pcVar4);
    return;
  case EXPR_MEM:
    if (expr->str != (char *)0x0) {
      fprintf((FILE *)out,"%s%s[",cmem);
    }
    printexpr(out,expr->expr1,0);
    if (expr->str == (char *)0x0) {
      return;
    }
    pcVar5 = "%s]";
    pcVar4 = cmem;
    goto LAB_0016c069;
  case EXPR_VEC:
    fprintf((FILE *)out,"%s{",cnorm);
    for (lVar6 = 0; lVar6 < expr->vexprsnum; lVar6 = lVar6 + 1) {
      fputc(0x20,(FILE *)out);
      printexpr(out,expr->vexprs[lVar6],0);
    }
    pcVar5 = " %s}";
    pcVar4 = cnorm;
    goto LAB_0016c069;
  case EXPR_DISCARD:
    pcVar5 = "%s#";
    pcVar4 = creg0;
    goto LAB_0016c069;
  case EXPR_BITFIELD:
    fprintf((FILE *)out,"%s%lld:%lld",cnum,expr->num1,expr->num2);
    return;
  case EXPR_NEG:
    pcVar4 = "%s-";
    goto LAB_0016bcae;
  case EXPR_NOT:
    goto switchD_0016bbc5_caseD_9;
  case EXPR_MUL:
    if (6 < lvl) {
      fprintf((FILE *)out,"%s(",cmem);
      printexpr(out,expr->expr1,6);
      pcVar4 = "%s*";
LAB_0016bf04:
      fprintf((FILE *)out,pcVar4,cmem);
      expr_00 = expr->expr2;
      iVar1 = 7;
      break;
    }
    printexpr(out,expr->expr1,6);
    pcVar4 = "%s*";
    goto LAB_0016bcab;
  case EXPR_DIV:
    if (6 < lvl) {
      fprintf((FILE *)out,"%s(",cmem);
      printexpr(out,expr->expr1,6);
      pcVar4 = "%s/";
      goto LAB_0016bf04;
    }
    printexpr(out,expr->expr1,6);
    pcVar4 = "%s/";
LAB_0016bcab:
    lVar6 = 0x28;
LAB_0016bcae:
    iVar1 = 7;
    goto switchD_0016bbc5_caseD_9;
  case EXPR_ADD:
    if (5 < lvl) {
      fprintf((FILE *)out,"%s(",cmem);
      printexpr(out,expr->expr1,5);
      pcVar4 = "%s+";
      goto LAB_0016be3c;
    }
    printexpr(out,expr->expr1,5);
    pcVar4 = "%s+";
LAB_0016bc82:
    iVar1 = 6;
LAB_0016bd67:
    lVar6 = 0x28;
switchD_0016bbc5_caseD_9:
    lvl = iVar1;
    fprintf((FILE *)out,pcVar4,cmem);
    expr = *(expr **)((long)&expr->type + lVar6);
    goto LAB_0016bba4;
  case EXPR_SUB:
    if (lvl < 6) {
      printexpr(out,expr->expr1,5);
      pcVar4 = "%s-";
      goto LAB_0016bc82;
    }
    fprintf((FILE *)out,"%s(",cmem);
    printexpr(out,expr->expr1,5);
    pcVar4 = "%s-";
LAB_0016be3c:
    fprintf((FILE *)out,pcVar4,cmem);
    expr_00 = expr->expr2;
    iVar1 = 6;
    break;
  case EXPR_SHL:
    if (lvl < 5) {
      printexpr(out,expr->expr1,4);
      pcVar4 = "%s<<";
LAB_0016bcf6:
      iVar1 = 5;
      goto LAB_0016bd67;
    }
    fprintf((FILE *)out,"%s(",cmem);
    printexpr(out,expr->expr1,4);
    pcVar4 = "%s<<";
    goto LAB_0016bf83;
  case EXPR_SHR:
    if (lvl < 5) {
      printexpr(out,expr->expr1,4);
      pcVar4 = "%s>>";
      goto LAB_0016bcf6;
    }
    fprintf((FILE *)out,"%s(",cmem);
    printexpr(out,expr->expr1,4);
    pcVar4 = "%s>>";
LAB_0016bf83:
    fprintf((FILE *)out,pcVar4,cmem);
    expr_00 = expr->expr2;
    iVar1 = 5;
    break;
  case EXPR_AND:
    if (lvl < 4) {
      printexpr(out,expr->expr1,3);
      pcVar4 = "%s&";
      iVar1 = 4;
      goto LAB_0016bd67;
    }
    fprintf((FILE *)out,"%s(",cmem);
    printexpr(out,expr->expr1,3);
    fprintf((FILE *)out,"%s&",cmem);
    expr_00 = expr->expr2;
    iVar1 = 4;
    break;
  case EXPR_XOR:
    if (lvl < 3) {
      printexpr(out,expr->expr1,2);
      pcVar4 = "%s^";
      iVar1 = 3;
      goto LAB_0016bd67;
    }
    fprintf((FILE *)out,"%s(",cmem);
    printexpr(out,expr->expr1,2);
    fprintf((FILE *)out,"%s^",cmem);
    expr_00 = expr->expr2;
    iVar1 = 3;
    break;
  case EXPR_OR:
    if (lvl < 2) {
      printexpr(out,expr->expr1,1);
      pcVar4 = "%s|";
      iVar1 = 2;
      goto LAB_0016bd67;
    }
    fprintf((FILE *)out,"%s(",cmem);
    printexpr(out,expr->expr1,1);
    fprintf((FILE *)out,"%s|",cmem);
    expr_00 = expr->expr2;
    iVar1 = 2;
    break;
  case EXPR_PIADD:
    if (lvl < 1) {
      printexpr(out,expr->expr1,0);
      pcVar4 = "%s++";
LAB_0016bd62:
      iVar1 = 1;
      goto LAB_0016bd67;
    }
    fprintf((FILE *)out,"%s(",cmem);
    printexpr(out,expr->expr1,0);
    pcVar4 = "%s++";
    goto LAB_0016c046;
  case EXPR_PISUB:
    if (lvl < 1) {
      printexpr(out,expr->expr1,0);
      pcVar4 = "%s--";
      goto LAB_0016bd62;
    }
    fprintf((FILE *)out,"%s(",cmem);
    printexpr(out,expr->expr1,0);
    pcVar4 = "%s--";
LAB_0016c046:
    fprintf((FILE *)out,pcVar4,cmem);
    expr_00 = expr->expr2;
    iVar1 = 1;
    break;
  case EXPR_SESTART:
    pcVar5 = "%s(";
    pcVar4 = cmem;
    goto LAB_0016c069;
  case EXPR_SEEND:
    goto LAB_0016c062;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/polachok[P]envytools/envydis/print.c"
                  ,0xdd,"void printexpr(FILE *, const struct expr *, int)");
  }
  printexpr(out,expr_00,iVar1);
LAB_0016c062:
  pcVar5 = "%s)";
  pcVar4 = cmem;
  goto LAB_0016c069;
switchD_0016bbc5_caseD_0:
  uVar2 = expr->special - 1;
  if (uVar2 < 3) {
    ppcVar3 = (char **)(&PTR_cbtarg_00170db8)[uVar2];
  }
  else {
    ppcVar3 = &cnum;
  }
  fputs(*ppcVar3,(FILE *)out);
  pcVar4 = (char *)expr->num1;
  if ((long)pcVar4 < 0) {
    pcVar4 = (char *)-(long)pcVar4;
    pcVar5 = "-%#llx";
  }
  else {
    pcVar5 = "%#llx";
  }
LAB_0016c069:
  fprintf((FILE *)out,pcVar5,pcVar4);
  return;
}

Assistant:

void printexpr(FILE *out, const struct expr *expr, int lvl) {
	int i;
	switch (expr->type) {
		case EXPR_NUM:
			switch (expr->special) {
				case 1:
					fprintf(out, "%s", cbtarg);
					break;
				case 2:
					fprintf(out, "%s", cctarg);
					break;
				case 3:
					fprintf(out, "%s", cmem);
					break;
				default:
					fprintf(out, "%s", cnum);
					break;
			}
			if (expr->num1 & 1ull << 63)
				fprintf(out, "-%#llx", -expr->num1);
			else
				fprintf(out, "%#llx", expr->num1);
			return;
		case EXPR_ID:
			switch (expr->special) {
				case 1:
					fprintf(out, "%s%s", cnum, expr->str);
					break;
				case 2:
					fprintf(out, "%s%s", cunk, expr->str);
					break;
				default:
					fprintf(out, "%s%s", cname, expr->str);
					break;
			}
			return;
		case EXPR_LABEL:
			switch (expr->special) {
				case 2:
					fprintf(out, "%s#%s", cunk, expr->str);
					break;
				default:
					fprintf(out, "%s#%s", cnum, expr->str);
					break;
			}
			return;
		case EXPR_REG:
			switch (expr->special) {
				case 1:
					fprintf(out, "%s$%s", creg1, expr->str);
					break;
				case 2:
					fprintf(out, "%s$%s", cunk, expr->str);
					break;
				default:
					fprintf(out, "%s$%s", creg0, expr->str);
					break;
			}
			return;
		case EXPR_MEM:
			if (expr->str)
				fprintf(out, "%s%s[", cmem, expr->str);
			printexpr(out, expr->expr1, 0);
			if (expr->str)
				fprintf(out, "%s]", cmem);
			return;
		case EXPR_VEC:
			fprintf(out, "%s{", cnorm);
			for (i = 0; i < expr->vexprsnum; i++) {
				fprintf(out, " ");
				printexpr(out, expr->vexprs[i], 0);
			}
			fprintf(out, " %s}", cnorm);
			return;
		case EXPR_DISCARD:
			fprintf(out, "%s#", creg0);
			return;
		case EXPR_BITFIELD:
			fprintf(out, "%s%lld:%lld", cnum, expr->num1, expr->num2);
			return;
		case EXPR_NEG:
			fprintf(out, "%s-", cmem);
			printexpr(out, expr->expr1, 7);
			return;
		case EXPR_NOT:
			fprintf(out, "%s~", cmem);
			printexpr(out, expr->expr1, 7);
			return;
		case EXPR_MUL:
			if (lvl >= 7)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 6);
			fprintf(out, "%s*", cmem);
			printexpr(out, expr->expr2, 7);
			if (lvl >= 7)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_DIV:
			if (lvl >= 7)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 6);
			fprintf(out, "%s/", cmem);
			printexpr(out, expr->expr2, 7);
			if (lvl >= 7)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_ADD:
			if (lvl >= 6)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 5);
			fprintf(out, "%s+", cmem);
			printexpr(out, expr->expr2, 6);
			if (lvl >= 6)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_SUB:
			if (lvl >= 6)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 5);
			fprintf(out, "%s-", cmem);
			printexpr(out, expr->expr2, 6);
			if (lvl >= 6)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_SHL:
			if (lvl >= 5)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 4);
			fprintf(out, "%s<<", cmem);
			printexpr(out, expr->expr2, 5);
			if (lvl >= 5)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_SHR:
			if (lvl >= 5)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 4);
			fprintf(out, "%s>>", cmem);
			printexpr(out, expr->expr2, 5);
			if (lvl >= 5)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_AND:
			if (lvl >= 4)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 3);
			fprintf(out, "%s&", cmem);
			printexpr(out, expr->expr2, 4);
			if (lvl >= 4)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_XOR:
			if (lvl >= 3)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 2);
			fprintf(out, "%s^", cmem);
			printexpr(out, expr->expr2, 3);
			if (lvl >= 3)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_OR:
			if (lvl >= 2)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 1);
			fprintf(out, "%s|", cmem);
			printexpr(out, expr->expr2, 2);
			if (lvl >= 2)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_PIADD:
			if (lvl >= 1)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 0);
			fprintf(out, "%s++", cmem);
			printexpr(out, expr->expr2, 1);
			if (lvl >= 1)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_PISUB:
			if (lvl >= 1)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 0);
			fprintf(out, "%s--", cmem);
			printexpr(out, expr->expr2, 1);
			if (lvl >= 1)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_SESTART:
			fprintf(out, "%s(", cmem);
			return;
		case EXPR_SEEND:
			fprintf(out, "%s)", cmem);
			return;
		default:
			assert(0);
	}
}